

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_types.cpp
# Opt level: O3

LogicalTypeModifier *
duckdb::LogicalTypeModifier::Deserialize
          (LogicalTypeModifier *__return_storage_ptr__,Deserializer *deserializer)

{
  uint uVar1;
  Value value;
  undefined1 *local_d0;
  undefined8 local_c8;
  undefined1 local_c0 [16];
  Value local_b0;
  Value local_70;
  
  (*deserializer->_vptr_Deserializer[2])(deserializer,100,"value");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  Value::Deserialize(&local_b0,deserializer);
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  Value::Value(&local_70,&local_b0);
  Value::Value(&__return_storage_ptr__->value,&local_70);
  (__return_storage_ptr__->label)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->label).field_2;
  (__return_storage_ptr__->label)._M_string_length = 0;
  (__return_storage_ptr__->label).field_2._M_local_buf[0] = '\0';
  Value::~Value(&local_70);
  uVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x65,"label");
  if ((char)uVar1 == '\0') {
    local_c8 = 0;
    local_c0[0] = 0;
    local_d0 = local_c0;
    ::std::__cxx11::string::operator=((string *)&__return_storage_ptr__->label,(string *)&local_d0);
    if (local_d0 == local_c0) goto LAB_005d49b1;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_d0,deserializer);
    ::std::__cxx11::string::operator=((string *)&__return_storage_ptr__->label,(string *)&local_d0);
    if (local_d0 == local_c0) goto LAB_005d49b1;
  }
  operator_delete(local_d0);
LAB_005d49b1:
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar1 & 0xff));
  Value::~Value(&local_b0);
  return __return_storage_ptr__;
}

Assistant:

LogicalTypeModifier LogicalTypeModifier::Deserialize(Deserializer &deserializer) {
	auto value = deserializer.ReadProperty<Value>(100, "value");
	LogicalTypeModifier result(value);
	deserializer.ReadPropertyWithDefault<string>(101, "label", result.label);
	return result;
}